

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DelayedObjects.hpp
# Opt level: O0

bool __thiscall
gmlc::concurrency::
DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
isRecognized(DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *this,int index)

{
  bool bVar1;
  iterator fnd2;
  iterator fnd;
  lock_guard<std::mutex> lock;
  map<int,_std::promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *in_stack_ffffffffffffff88;
  lock_guard<std::mutex> *in_stack_ffffffffffffff90;
  _Self local_58;
  _Self local_50;
  undefined4 local_44;
  _Self local_40 [3];
  _Self local_28 [4];
  byte local_1;
  
  CLI::std::lock_guard<std::mutex>::lock_guard
            (in_stack_ffffffffffffff90,(mutex_type *)in_stack_ffffffffffffff88);
  local_28[0]._M_node =
       (_Base_ptr)
       std::
       map<int,_std::promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
       ::find(in_stack_ffffffffffffff88,(key_type_conflict2 *)0x568db4);
  local_40[0]._M_node =
       (_Base_ptr)
       std::
       map<int,_std::promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
       ::end(in_stack_ffffffffffffff88);
  bVar1 = std::operator==(local_28,local_40);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    local_50._M_node =
         (_Base_ptr)
         std::
         map<int,_std::promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
         ::find(in_stack_ffffffffffffff88,(key_type_conflict2 *)0x568e30);
    local_58._M_node =
         (_Base_ptr)
         std::
         map<int,_std::promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
         ::end(in_stack_ffffffffffffff88);
    bVar1 = std::operator==(&local_50,&local_58);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      local_1 = 0;
    }
    else {
      local_1 = 1;
    }
  }
  else {
    local_1 = 1;
  }
  local_44 = 1;
  CLI::std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x568e94);
  return (bool)(local_1 & 1);
}

Assistant:

bool isRecognized(int index)
    {
        std::lock_guard<std::mutex> lock(promiseLock);
        auto fnd = promiseByInteger.find(index);
        if (fnd != promiseByInteger.end()) {
            return true;
        }
        auto fnd2 = usedPromiseByInteger.find(index);
        if (fnd2 != usedPromiseByInteger.end()) {
            return true;
        }
        return false;
    }